

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  float size;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImRect *pIVar9;
  ImU32 col;
  ImVec2 *pIVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_60;
  ImVec4 local_58;
  ImVec2 local_40;
  float local_38;
  float local_34;
  undefined1 extraout_var [56];
  
  local_60 = *pos_min;
  if (text_size_if_known == (ImVec2 *)0x0) {
    size = GImGui->FontSize;
    if (text_display_end == text) {
      auVar12 = vinsertps_avx(ZEXT416((uint)size),ZEXT416((uint)size),0x1d);
    }
    else {
      auVar11._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,size,3.4028235e+38,0.0,text,text_display_end,(char **)0x0);
      auVar11._8_56_ = extraout_var;
      auVar12 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar11._0_4_ + 0.95)));
      auVar12._4_12_ = auVar11._4_12_;
    }
  }
  else {
    auVar12._8_8_ = 0;
    auVar12._0_4_ = text_size_if_known->x;
    auVar12._4_4_ = text_size_if_known->y;
  }
  pIVar10 = &clip_rect->Max;
  pIVar9 = clip_rect;
  if (clip_rect == (ImRect *)0x0) {
    pIVar10 = pos_max;
    pIVar9 = (ImRect *)pos_min;
  }
  bVar1 = true;
  auVar2 = vmovshdup_avx(auVar12);
  if (local_60.x + auVar12._0_4_ < pIVar10->x) {
    bVar1 = pIVar10->y <= auVar2._0_4_ + local_60.y;
  }
  if (clip_rect != (ImRect *)0x0) {
    bVar4 = true;
    if ((pIVar9->Min).x <= local_60.x) {
      bVar4 = local_60.y < (pIVar9->Min).y;
    }
    bVar1 = (bool)(bVar1 | bVar4);
  }
  if (0.0 < align->x) {
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)align->x),
                              ZEXT416((uint)((pos_max->x - local_60.x) - auVar12._0_4_)),
                              ZEXT416((uint)local_60.x));
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)local_60.x),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    local_60.x = (float)((uint)bVar4 * (int)local_60.x + (uint)!bVar4 * auVar12._0_4_);
  }
  if (0.0 < align->y) {
    auVar12 = vfmadd213ss_fma(ZEXT416((uint)align->y),
                              ZEXT416((uint)((pos_max->y - local_60.y) - auVar2._0_4_)),
                              ZEXT416((uint)local_60.y));
    uVar3 = vcmpss_avx512f(auVar12,ZEXT416((uint)local_60.y),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    local_60.y = (float)((uint)bVar4 * (int)local_60.y + (uint)!bVar4 * auVar12._0_4_);
  }
  if (bVar1) {
    local_34 = pIVar10->y;
    local_40 = pIVar9->Min;
    cpu_fine_clip_rect = (ImVec4 *)&local_40;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar5 = (GImGui->Style).Colors[0].z;
    uVar6 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar6;
    local_58.z = (float)uVar5;
    local_38 = pIVar10->x;
    col = ColorConvertFloat4ToU32(&local_58);
  }
  else {
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar7 = (GImGui->Style).Colors[0].z;
    uVar8 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar8;
    local_58.z = (float)uVar7;
    col = ColorConvertFloat4ToU32(&local_58);
    cpu_fine_clip_rect = (ImVec4 *)0x0;
  }
  ImDrawList::AddText(draw_list,(ImFont *)0x0,0.0,&local_60,col,text,text_display_end,0.0,
                      cpu_fine_clip_rect);
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}